

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

ctmbstr prvTidyGetEncodingNameFromTidyId(uint id)

{
  long lVar1;
  long lVar2;
  
  if (id == 1) {
    return "us-ascii";
  }
  lVar1 = 0x18;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x18 == 0x138) {
      return (ctmbstr)0x0;
    }
    lVar1 = lVar2 + 0x18;
  } while (*(uint *)((long)&enc2iana[0].id + lVar2) != id);
  return *(ctmbstr *)((long)&enc2iana[0].name + lVar2);
}

Assistant:

ctmbstr TY_(GetEncodingNameFromTidyId)(uint id)
{
    uint i;

    for (i = 0; enc2iana[i].name; ++i)
        if (enc2iana[i].id == id)
            return enc2iana[i].name;

    return NULL;
}